

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall MetaSim::Event::post(Event *this,Tick myTime,bool disp)

{
  long lVar1;
  bool bVar2;
  Simulation *pSVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  Tick actTime;
  string *message;
  byte in_DL;
  impl_t in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool> pVar7;
  stringstream str_2;
  pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool> p;
  stringstream str_1;
  stringstream str;
  string *in_stack_fffffffffffff878;
  allocator *md;
  pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool> *in_stack_fffffffffffff880;
  allocator *cl;
  string *in_stack_fffffffffffff888;
  Exc *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff928;
  allocator local_669;
  string local_668 [39];
  allocator local_641;
  string local_640 [64];
  impl_t local_600;
  stringstream local_5f8 [16];
  ostream local_5e8 [376];
  _Base_ptr local_470;
  undefined1 local_468;
  pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool> local_458;
  pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool> local_448;
  impl_t local_438;
  undefined1 local_42a;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [64];
  impl_t local_3c0;
  stringstream local_3b8 [16];
  ostream local_3a8 [376];
  Tick local_230;
  undefined1 local_222;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [64];
  impl_t local_1b8;
  stringstream local_1a0 [16];
  ostream local_190 [383];
  byte local_11;
  Tick local_8;
  
  local_11 = in_DL & 1;
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Time: ");
    pSVar3 = Simulation::getInstance();
    local_1b8 = (impl_t)Simulation::getTime(pSVar3);
    poVar4 = MetaSim::operator<<((ostream *)in_stack_fffffffffffff880,
                                 (Tick *)in_stack_fffffffffffff878);
    poVar4 = std::operator<<(poVar4," -- Event");
    if (in_RDI == (long *)0x0) {
      __cxa_bad_typeid();
    }
    pcVar5 = std::type_info::name(*(type_info **)(*in_RDI + -8));
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4," already posted");
    local_222 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Event",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"event.cpp",&local_221);
    Exc::Exc(in_stack_fffffffffffff890,in_stack_fffffffffffff888,(string *)in_stack_fffffffffffff880
             ,in_stack_fffffffffffff878);
    local_222 = 0;
    __cxa_throw(uVar6,&Exc::typeinfo,Exc::~Exc);
  }
  local_8.v = in_RSI;
  pSVar3 = Simulation::getInstance();
  actTime = Simulation::getTime(pSVar3);
  local_230 = actTime;
  bVar2 = operator<(&local_8,&local_230);
  if (!bVar2) {
    local_438 = local_8.v;
    setTime((Event *)CONCAT17(bVar2,in_stack_fffffffffffff928),actTime);
    lVar1 = counter + 1;
    in_RDI[1] = counter;
    counter = lVar1;
    std::pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool>::
    pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool,_true>(in_stack_fffffffffffff880);
    pVar7 = priority_list<MetaSim::Event_*,_MetaSim::Event::Cmp,_std::allocator<MetaSim::Event_*>_>
            ::insert((priority_list<MetaSim::Event_*,_MetaSim::Event::Cmp,_std::allocator<MetaSim::Event_*>_>
                      *)in_stack_fffffffffffff890,(const_reference)in_stack_fffffffffffff888);
    local_470 = (_Base_ptr)pVar7.first._M_node;
    local_468 = pVar7.second;
    local_458.first._M_node = local_470;
    local_458.second = (bool)local_468;
    std::pair<std::_Rb_tree_const_iterator<MetaSim::Event_*>,_bool>::operator=
              (&local_448,&local_458);
    if ((local_448.second & 1U) == 0) {
      std::__cxx11::stringstream::stringstream(local_5f8);
      std::operator<<(local_5e8,"Time: ");
      pSVar3 = Simulation::getInstance();
      local_600 = (impl_t)Simulation::getTime(pSVar3);
      poVar4 = MetaSim::operator<<((ostream *)in_stack_fffffffffffff880,
                                   (Tick *)in_stack_fffffffffffff878);
      poVar4 = std::operator<<(poVar4," -- Posting event");
      if (in_RDI == (long *)0x0) {
        __cxa_bad_typeid();
      }
      pcVar5 = std::type_info::name(*(type_info **)(*in_RDI + -8));
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," Already in queue!, at time = ");
      MetaSim::operator<<((ostream *)in_stack_fffffffffffff880,(Tick *)in_stack_fffffffffffff878);
      message = (string *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringstream::str();
      cl = &local_641;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_640,"Event",cl);
      md = &local_669;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,"event.cpp",md);
      Exc::Exc((Exc *)poVar4,message,(string *)cl,(string *)md);
      __cxa_throw(message,&Exc::typeinfo,Exc::~Exc);
    }
    *(undefined1 *)(in_RDI + 2) = 1;
    *(byte *)(in_RDI + 0x10) = local_11 & 1;
    (**(code **)(*in_RDI + 0x18))();
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3b8);
  std::operator<<(local_3a8,"Time: ");
  pSVar3 = Simulation::getInstance();
  local_3c0 = (impl_t)Simulation::getTime(pSVar3);
  poVar4 = MetaSim::operator<<((ostream *)in_stack_fffffffffffff880,
                               (Tick *)in_stack_fffffffffffff878);
  poVar4 = std::operator<<(poVar4," -- Posting event");
  if (in_RDI == (long *)0x0) {
    __cxa_bad_typeid();
  }
  pcVar5 = std::type_info::name(*(type_info **)(*in_RDI + -8));
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4," in the past at time: ");
  MetaSim::operator<<((ostream *)in_stack_fffffffffffff880,(Tick *)in_stack_fffffffffffff878);
  local_42a = 1;
  uVar6 = __cxa_allocate_exception(0x30);
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"Event",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"event.cpp",&local_429);
  Exc::Exc(in_stack_fffffffffffff890,in_stack_fffffffffffff888,(string *)in_stack_fffffffffffff880,
           in_stack_fffffffffffff878);
  local_42a = 0;
  __cxa_throw(uVar6,&Exc::typeinfo,Exc::~Exc);
}

Assistant:

void Event::post(Tick myTime, bool disp) throw (Exc, BaseExc)
    {
        if (_isInQueue) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Event" 
                << typeid(*this).name() << " already posted";
            throw Exc(str.str());
        }

        if (myTime < SIMUL.getTime()) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " in the past at time: " 
                << myTime;
            throw Exc(str.str());
        }

        setTime(myTime);

        _order = counter++;

        std::pair<EventQueue::iterator,bool> p;
        p =_eventQueue.insert(this);
    
        if (!p.second) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " Already in queue!, at time = " << myTime;
            throw Exc(str.str());
        }

        _isInQueue = true;
        _disposable = disp;

        DBGENTER(_EVENT_DBG_LEV);
        print();
        
    }